

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_div_qr_1_preinv(mp_ptr qp,mp_srcptr np,mp_size_t nn,gmp_div_inverse *inv)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  mp_limb_t __x;
  mp_limb_t __v;
  mp_limb_t __u;
  uint __vh;
  uint __uh;
  uint __vl;
  uint __ul;
  mp_limb_t __x3;
  mp_limb_t __x2;
  mp_limb_t __x1;
  mp_limb_t __x0;
  mp_limb_t _mask;
  mp_limb_t _r;
  mp_limb_t _ql;
  mp_limb_t _qh;
  mp_limb_t q;
  mp_ptr tp;
  mp_limb_t r;
  mp_limb_t di;
  mp_limb_t d;
  gmp_div_inverse *inv_local;
  mp_size_t nn_local;
  mp_srcptr np_local;
  mp_ptr qp_local;
  
  q = 0;
  if (inv->shift == 0) {
    tp = (mp_ptr)0x0;
    nn_local = (mp_size_t)np;
  }
  else {
    q = (mp_limb_t)gmp_xalloc_limbs(nn);
    tp = (mp_ptr)mpn_lshift((mp_ptr)q,np,nn,inv->shift);
    nn_local = q;
  }
  uVar1 = inv->d1;
  uVar2 = inv->di;
  inv_local = (gmp_div_inverse *)nn;
  while (inv_local = (gmp_div_inverse *)((long)&inv_local[-1].di + 7), -1 < (long)inv_local) {
    uVar3 = (uint)((ulong)tp >> 0x20);
    uVar4 = (uint)(uVar2 >> 0x20);
    uVar5 = ((ulong)tp & 0xffffffff) * (uVar2 & 0xffffffff);
    uVar6 = (ulong)uVar3 * (uVar2 & 0xffffffff);
    ___vl = (ulong)uVar3 * (ulong)uVar4;
    uVar7 = uVar6 + (uVar5 >> 0x20) + ((ulong)tp & 0xffffffff) * (ulong)uVar4;
    if (uVar7 < uVar6) {
      ___vl = ___vl + 0x100000000;
    }
    uVar5 = (uVar7 << 0x20) + (uVar5 & 0xffffffff);
    uVar6 = uVar5 + *(long *)(nn_local + (long)inv_local * 8);
    lVar8 = (long)tp + (long)(int)(uint)(uVar6 < uVar5) + ___vl + (uVar7 >> 0x20) + 1;
    uVar7 = *(long *)(nn_local + (long)inv_local * 8) - lVar8 * uVar1;
    uVar5 = -(long)(int)(uint)(uVar6 < uVar7);
    _ql = uVar5 + lVar8;
    _mask = (uVar5 & uVar1) + uVar7;
    if (uVar1 <= _mask) {
      _mask = _mask - uVar1;
      _ql = _ql + 1;
    }
    tp = (mp_ptr)_mask;
    if (qp != (mp_ptr)0x0) {
      qp[(long)inv_local] = _ql;
    }
  }
  if (inv->shift != 0) {
    (*gmp_free_func)((void *)q,0);
  }
  return (ulong)tp >> ((byte)inv->shift & 0x3f);
}

Assistant:

static mp_limb_t
mpn_div_qr_1_preinv (mp_ptr qp, mp_srcptr np, mp_size_t nn,
		     const struct gmp_div_inverse *inv)
{
  mp_limb_t d, di;
  mp_limb_t r;
  mp_ptr tp = NULL;

  if (inv->shift > 0)
    {
      tp = gmp_xalloc_limbs (nn);
      r = mpn_lshift (tp, np, nn, inv->shift);
      np = tp;
    }
  else
    r = 0;

  d = inv->d1;
  di = inv->di;
  while (--nn >= 0)
    {
      mp_limb_t q;

      gmp_udiv_qrnnd_preinv (q, r, r, np[nn], d, di);
      if (qp)
	qp[nn] = q;
    }
  if (inv->shift > 0)
    gmp_free (tp);

  return r >> inv->shift;
}